

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Sum::backward_impl
          (Sum *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  long in_RDX;
  Tensor *in_RSI;
  Tensor *in_RDI;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *unaff_retaddr;
  Device_CPU *in_stack_00000008;
  Sum *in_stack_00000010;
  undefined4 in_stack_00000020;
  
  if (*(long *)(in_RDX + 0x48) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x78a,
                  "virtual void dynet::Sum::backward_impl(const std::vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)(in_RDX + 0x48) + 0xc) == 0) {
    backward_dev_impl<dynet::Device_CPU>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,
               (uint)((ulong)in_RDX >> 0x20),(Tensor *)CONCAT44(i,in_stack_00000020));
    return;
  }
  abort();
}

Assistant:

void SumBatches::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 1);
  unsigned num_args = xs[0]->d.bd;
#if __CUDACC__
  TensorTools::Zero(fx);
  for (unsigned i = 0; i < num_args; ++i)
    CUBLAS_CHECK(cublasSaxpy(dev.cublas_handle, fx.d.size(), kSCALAR_ONE, xs[0]->v + i * xs[0]->d.batch_size(), 1, fx.v, 1));
#else
  auto res = *fx;
  const unsigned remainder = num_args % 4;
  switch (remainder) {
    case 0: res.setZero(); break;
    case 1: res = xs[0]->batch_matrix(0); break;
    case 2: res = xs[0]->batch_matrix(0) + xs[0]->batch_matrix(1); break;
    case 3: res = xs[0]->batch_matrix(0) + xs[0]->batch_matrix(1) + xs[0]->batch_matrix(2); break;
  }
  for (unsigned i = remainder; i < num_args; i += 4)
    res += xs[0]->batch_matrix(i) + xs[0]->batch_matrix(i+1) + xs[0]->batch_matrix(i+2) + xs[0]->batch_matrix(i+3);
#endif
}